

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestPartResult
          (PrettyUnitTestResultPrinter *this,TestPartResult *result)

{
  TestPartResult *in_RDX;
  string local_30;
  
  if (result->type_ != kSuccess) {
    PrintTestPartResultToString_abi_cxx11_(&local_30,(internal *)result,in_RDX);
    puts(local_30._M_dataplus._M_p);
    fflush(_stdout);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    fflush(_stdout);
  }
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestPartResult(
    const TestPartResult& result) {
  switch (result.type()) {
    // If the test part succeeded, we don't need to do anything.
    case TestPartResult::kSuccess:
      return;
    default:
      // Print failure message from the assertion
      // (e.g. expected this and got that).
      PrintTestPartResult(result);
      fflush(stdout);
  }
}